

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-bignum-dtoa.cc
# Opt level: O0

void TestBignumDtoaShortestVariousFloats(void)

{
  float fVar1;
  uint32_t largest_denormal32;
  double v;
  uint32_t smallest_normal32;
  float max_float;
  float min_float;
  int point;
  int length;
  Vector<char> buffer;
  char buffer_container [100];
  int *in_stack_00000770;
  int *in_stack_00000778;
  int in_stack_00000780;
  BignumDtoaMode in_stack_00000784;
  double in_stack_00000788;
  Vector<char> in_stack_00000790;
  undefined4 in_stack_fffffffffffffea8;
  int in_stack_fffffffffffffeac;
  char *in_stack_fffffffffffffeb0;
  char *pcVar2;
  char *in_stack_fffffffffffffeb8;
  char *expected;
  Single in_stack_fffffffffffffec0;
  undefined4 in_stack_fffffffffffffec4;
  undefined4 uVar3;
  undefined8 in_stack_fffffffffffffec8;
  int iVar4;
  char *in_stack_fffffffffffffed0;
  char *file;
  Single local_124;
  double local_120;
  undefined4 local_114;
  char *local_110;
  char *local_108;
  char *local_100;
  char *local_f8;
  char *local_f0;
  char *local_e8;
  char *local_e0;
  char *local_d8;
  char *local_d0;
  char *local_c8;
  char *local_c0;
  char *local_b8;
  char *local_b0;
  char *local_a8;
  undefined4 local_9c;
  char *local_98;
  char *local_90;
  undefined4 local_84;
  undefined1 local_78 [16];
  char local_68 [104];
  
  iVar4 = (int)((ulong)in_stack_fffffffffffffec8 >> 0x20);
  double_conversion::Vector<char>::Vector((Vector<char> *)local_78,local_68,100);
  local_84 = 1;
  local_98 = (char *)local_78._0_8_;
  local_90 = (char *)local_78._8_8_;
  double_conversion::BignumDtoa
            (in_stack_00000788,in_stack_00000784,in_stack_00000780,in_stack_00000790,
             in_stack_00000778,in_stack_00000770);
  double_conversion::Vector<char>::start((Vector<char> *)local_78);
  CheckEqualsHelper(in_stack_fffffffffffffed0,iVar4,
                    (char *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0.d32_),
                    in_stack_fffffffffffffeb8,in_stack_fffffffffffffeb0,
                    (char *)CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8));
  CheckEqualsHelper(in_stack_fffffffffffffed0,iVar4,
                    (char *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0.d32_),
                    (int)((ulong)in_stack_fffffffffffffeb8 >> 0x20),in_stack_fffffffffffffeb0,
                    in_stack_fffffffffffffeac);
  local_9c = 0x7f7fffff;
  local_b0 = (char *)local_78._0_8_;
  local_a8 = (char *)local_78._8_8_;
  double_conversion::BignumDtoa
            (in_stack_00000788,in_stack_00000784,in_stack_00000780,in_stack_00000790,
             in_stack_00000778,in_stack_00000770);
  double_conversion::Vector<char>::start((Vector<char> *)local_78);
  CheckEqualsHelper(in_stack_fffffffffffffed0,iVar4,
                    (char *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0.d32_),
                    in_stack_fffffffffffffeb8,in_stack_fffffffffffffeb0,
                    (char *)CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8));
  CheckEqualsHelper(in_stack_fffffffffffffed0,iVar4,
                    (char *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0.d32_),
                    (int)((ulong)in_stack_fffffffffffffeb8 >> 0x20),in_stack_fffffffffffffeb0,
                    in_stack_fffffffffffffeac);
  local_c0 = (char *)local_78._0_8_;
  local_b8 = (char *)local_78._8_8_;
  double_conversion::BignumDtoa
            (in_stack_00000788,in_stack_00000784,in_stack_00000780,in_stack_00000790,
             in_stack_00000778,in_stack_00000770);
  double_conversion::Vector<char>::start((Vector<char> *)local_78);
  CheckEqualsHelper(in_stack_fffffffffffffed0,iVar4,
                    (char *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0.d32_),
                    in_stack_fffffffffffffeb8,in_stack_fffffffffffffeb0,
                    (char *)CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8));
  CheckEqualsHelper(in_stack_fffffffffffffed0,iVar4,
                    (char *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0.d32_),
                    (int)((ulong)in_stack_fffffffffffffeb8 >> 0x20),in_stack_fffffffffffffeb0,
                    in_stack_fffffffffffffeac);
  local_d0 = (char *)local_78._0_8_;
  local_c8 = (char *)local_78._8_8_;
  double_conversion::BignumDtoa
            (in_stack_00000788,in_stack_00000784,in_stack_00000780,in_stack_00000790,
             in_stack_00000778,in_stack_00000770);
  double_conversion::Vector<char>::start((Vector<char> *)local_78);
  CheckEqualsHelper(in_stack_fffffffffffffed0,iVar4,
                    (char *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0.d32_),
                    in_stack_fffffffffffffeb8,in_stack_fffffffffffffeb0,
                    (char *)CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8));
  CheckEqualsHelper(in_stack_fffffffffffffed0,iVar4,
                    (char *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0.d32_),
                    (int)((ulong)in_stack_fffffffffffffeb8 >> 0x20),in_stack_fffffffffffffeb0,
                    in_stack_fffffffffffffeac);
  local_e0 = (char *)local_78._0_8_;
  local_d8 = (char *)local_78._8_8_;
  double_conversion::BignumDtoa
            (in_stack_00000788,in_stack_00000784,in_stack_00000780,in_stack_00000790,
             in_stack_00000778,in_stack_00000770);
  double_conversion::Vector<char>::start((Vector<char> *)local_78);
  CheckEqualsHelper(in_stack_fffffffffffffed0,iVar4,
                    (char *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0.d32_),
                    in_stack_fffffffffffffeb8,in_stack_fffffffffffffeb0,
                    (char *)CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8));
  CheckEqualsHelper(in_stack_fffffffffffffed0,iVar4,
                    (char *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0.d32_),
                    (int)((ulong)in_stack_fffffffffffffeb8 >> 0x20),in_stack_fffffffffffffeb0,
                    in_stack_fffffffffffffeac);
  local_f0 = (char *)local_78._0_8_;
  local_e8 = (char *)local_78._8_8_;
  double_conversion::BignumDtoa
            (in_stack_00000788,in_stack_00000784,in_stack_00000780,in_stack_00000790,
             in_stack_00000778,in_stack_00000770);
  double_conversion::Vector<char>::start((Vector<char> *)local_78);
  CheckEqualsHelper(in_stack_fffffffffffffed0,iVar4,
                    (char *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0.d32_),
                    in_stack_fffffffffffffeb8,in_stack_fffffffffffffeb0,
                    (char *)CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8));
  CheckEqualsHelper(in_stack_fffffffffffffed0,iVar4,
                    (char *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0.d32_),
                    (int)((ulong)in_stack_fffffffffffffeb8 >> 0x20),in_stack_fffffffffffffeb0,
                    in_stack_fffffffffffffeac);
  local_100 = (char *)local_78._0_8_;
  local_f8 = (char *)local_78._8_8_;
  double_conversion::BignumDtoa
            (in_stack_00000788,in_stack_00000784,in_stack_00000780,in_stack_00000790,
             in_stack_00000778,in_stack_00000770);
  double_conversion::Vector<char>::start((Vector<char> *)local_78);
  CheckEqualsHelper(in_stack_fffffffffffffed0,iVar4,
                    (char *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0.d32_),
                    in_stack_fffffffffffffeb8,in_stack_fffffffffffffeb0,
                    (char *)CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8));
  CheckEqualsHelper(in_stack_fffffffffffffed0,iVar4,
                    (char *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0.d32_),
                    (int)((ulong)in_stack_fffffffffffffeb8 >> 0x20),in_stack_fffffffffffffeb0,
                    in_stack_fffffffffffffeac);
  local_110 = (char *)local_78._0_8_;
  local_108 = (char *)local_78._8_8_;
  double_conversion::BignumDtoa
            (in_stack_00000788,in_stack_00000784,in_stack_00000780,in_stack_00000790,
             in_stack_00000778,in_stack_00000770);
  double_conversion::Vector<char>::start((Vector<char> *)local_78);
  CheckEqualsHelper(in_stack_fffffffffffffed0,iVar4,
                    (char *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0.d32_),
                    in_stack_fffffffffffffeb8,in_stack_fffffffffffffeb0,
                    (char *)CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8));
  CheckEqualsHelper(in_stack_fffffffffffffed0,iVar4,
                    (char *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0.d32_),
                    (int)((ulong)in_stack_fffffffffffffeb8 >> 0x20),in_stack_fffffffffffffeb0,
                    in_stack_fffffffffffffeac);
  local_114 = 0x800000;
  double_conversion::Single::Single(&local_124,0x800000);
  fVar1 = double_conversion::Single::value((Single *)0x82b99b);
  local_120 = (double)fVar1;
  pcVar2 = (char *)local_78._0_8_;
  file = (char *)local_78._8_8_;
  double_conversion::BignumDtoa
            (in_stack_00000788,in_stack_00000784,in_stack_00000780,in_stack_00000790,
             in_stack_00000778,in_stack_00000770);
  iVar4 = (int)((ulong)pcVar2 >> 0x20);
  double_conversion::Vector<char>::start((Vector<char> *)local_78);
  CheckEqualsHelper(file,iVar4,
                    (char *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0.d32_),
                    in_stack_fffffffffffffeb8,in_stack_fffffffffffffeb0,
                    (char *)CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8));
  CheckEqualsHelper(file,iVar4,
                    (char *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0.d32_),
                    (int)((ulong)in_stack_fffffffffffffeb8 >> 0x20),in_stack_fffffffffffffeb0,
                    in_stack_fffffffffffffeac);
  uVar3 = 0x7fffff;
  double_conversion::Single::Single((Single *)&stack0xfffffffffffffec0,0x7fffff);
  fVar1 = double_conversion::Single::value((Single *)0x82ba6c);
  local_120 = (double)fVar1;
  pcVar2 = (char *)local_78._0_8_;
  expected = (char *)local_78._8_8_;
  double_conversion::BignumDtoa
            (in_stack_00000788,in_stack_00000784,in_stack_00000780,in_stack_00000790,
             in_stack_00000778,in_stack_00000770);
  double_conversion::Vector<char>::start((Vector<char> *)local_78);
  CheckEqualsHelper(file,iVar4,(char *)CONCAT44(uVar3,in_stack_fffffffffffffec0.d32_),expected,
                    pcVar2,(char *)CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8));
  CheckEqualsHelper(file,iVar4,(char *)CONCAT44(uVar3,in_stack_fffffffffffffec0.d32_),
                    (int)((ulong)expected >> 0x20),pcVar2,in_stack_fffffffffffffeac);
  return;
}

Assistant:

TEST(BignumDtoaShortestVariousFloats) {
  char buffer_container[kBufferSize];
  Vector<char> buffer(buffer_container, kBufferSize);
  int length;
  int point;

  float min_float = 1e-45f;
  BignumDtoa(min_float, BIGNUM_DTOA_SHORTEST_SINGLE, 0,
             buffer, &length, &point);
  CHECK_EQ("1", buffer.start());
  CHECK_EQ(-44, point);


  float max_float = 3.4028234e38f;
  BignumDtoa(max_float, BIGNUM_DTOA_SHORTEST_SINGLE, 0,
             buffer, &length, &point);
  CHECK_EQ("34028235", buffer.start());
  CHECK_EQ(39, point);

  BignumDtoa(4294967272.0f, BIGNUM_DTOA_SHORTEST_SINGLE, 0,
             buffer, &length, &point);
  CHECK_EQ("42949673", buffer.start());
  CHECK_EQ(10, point);

  BignumDtoa(3.32306998946228968226e+35f, BIGNUM_DTOA_SHORTEST_SINGLE, 0,
             buffer, &length, &point);
  CHECK_EQ("332307", buffer.start());
  CHECK_EQ(36, point);

  BignumDtoa(1.2341e-41f, BIGNUM_DTOA_SHORTEST_SINGLE, 0,
             buffer, &length, &point);
  CHECK_EQ("12341", buffer.start());
  CHECK_EQ(-40, point);

  BignumDtoa(3.3554432e7, BIGNUM_DTOA_SHORTEST_SINGLE, 0,
             buffer, &length, &point);
  CHECK_EQ("33554432", buffer.start());
  CHECK_EQ(8, point);

  BignumDtoa(3.26494756798464e14f, BIGNUM_DTOA_SHORTEST_SINGLE, 0,
             buffer, &length, &point);
  CHECK_EQ("32649476", buffer.start());
  CHECK_EQ(15, point);

  BignumDtoa(3.91132223637771935344e37f, BIGNUM_DTOA_SHORTEST_SINGLE, 0,
             buffer, &length, &point);
  CHECK_EQ("39113222", buffer.start());
  CHECK_EQ(38, point);

  uint32_t smallest_normal32 = 0x00800000;
  double v = Single(smallest_normal32).value();
  BignumDtoa(v, BIGNUM_DTOA_SHORTEST_SINGLE, 0, buffer, &length, &point);
  CHECK_EQ("11754944", buffer.start());
  CHECK_EQ(-37, point);

  uint32_t largest_denormal32 = 0x007FFFFF;
  v = Single(largest_denormal32).value();
  BignumDtoa(v, BIGNUM_DTOA_SHORTEST_SINGLE, 0, buffer, &length, &point);
  CHECK_EQ("11754942", buffer.start());
  CHECK_EQ(-37, point);
}